

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall EventLoopThread::~EventLoopThread(EventLoopThread *this)

{
  long lVar1;
  Thread *in_RDI;
  
  *(undefined1 *)
   &(((shared_ptr<Epoll> *)&in_RDI->pthreadId_)->
    super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = 1;
  lVar1._0_1_ = in_RDI->started_;
  lVar1._1_1_ = in_RDI->joined_;
  lVar1._2_6_ = *(undefined6 *)&in_RDI->field_0x2;
  if (lVar1 != 0) {
    EventLoop::quit((EventLoop *)in_RDI);
    Thread::join(in_RDI);
  }
  Condition::~Condition((Condition *)0x10bdaf);
  MutexLock::~MutexLock((MutexLock *)in_RDI);
  Thread::~Thread(in_RDI);
  return;
}

Assistant:

EventLoopThread::~EventLoopThread(){
    exiting_ = true;
    if(loop_!=nullptr){
        loop_->quit();
        thread_.join();
    }
}